

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::HexHugeIntOperator::Operation<duckdb::hugeint_t,duckdb::string_t>
          (HexHugeIntOperator *this,hugeint_t input,Vector *result)

{
  uint uVar1;
  long lVar2;
  HexHugeIntOperator *pHVar3;
  StringVector *this_00;
  undefined1 *puVar4;
  char *pcVar5;
  HexHugeIntOperator *pHVar6;
  ulong uVar7;
  string_t target;
  undefined1 local_28 [16];
  
  this_00 = (StringVector *)input.upper;
  pHVar6 = (HexHugeIntOperator *)input.lower;
  lVar2 = 0x3f;
  pHVar3 = pHVar6;
  if ((pHVar6 == (HexHugeIntOperator *)0x0) &&
     (lVar2 = 0x7f, pHVar3 = this, this == (HexHugeIntOperator *)0x0)) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = (ulong)pHVar3 >> 1 | (ulong)pHVar3;
    uVar7 = uVar7 >> 2 | uVar7;
    uVar7 = uVar7 >> 4 | uVar7;
    uVar7 = uVar7 >> 8 | uVar7;
    uVar7 = uVar7 >> 0x10 | uVar7;
    uVar7 = (ulong)(lVar2 - *(long *)(&DAT_013cb530 +
                                     ((uVar7 >> 0x20 | uVar7) * 0x3f79d71b4cb0a89 >> 0x3a) * 8)) >>
            2;
  }
  if (uVar7 == 0x20) {
    local_28 = (undefined1  [16])
               StringVector::EmptyString(this_00,(Vector *)&DAT_00000001,(idx_t)this_00);
    uVar1 = local_28._0_4_;
    puVar4 = local_28._8_8_;
    if (uVar1 < 0xd) {
      puVar4 = local_28 + 4;
    }
    *puVar4 = 0x30;
  }
  else {
    local_28 = (undefined1  [16])
               StringVector::EmptyString(this_00,(Vector *)(0x20 - uVar7),(idx_t)this_00);
    uVar1 = local_28._0_4_;
    pcVar5 = local_28._8_8_;
    if (uVar1 < 0xd) {
      pcVar5 = local_28 + 4;
    }
    for (uVar7 = (long)(0x20 - uVar7) * 4; 0x43 < uVar7; uVar7 = uVar7 - 4) {
      *pcVar5 = "0123456789ABCDEF"[(uint)((long)pHVar6 >> ((char)uVar7 + 0xbcU & 0x3f)) & 0xf];
      pcVar5 = pcVar5 + 1;
    }
    if (uVar7 != 0) {
      lVar2 = uVar7 - 4;
      do {
        *pcVar5 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar2 & 0x3f)) & 0xf];
        pcVar5 = pcVar5 + 1;
        lVar2 = lVar2 + -4;
      } while (lVar2 != -4);
    }
  }
  uVar7 = (ulong)uVar1;
  if (uVar7 < 0xd) {
    switchD_00570541::default(local_28 + uVar7 + 4,0,0xc - uVar7);
  }
  else {
    local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<hugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<hugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}